

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsAppsExport.cpp
# Opt level: O2

shared_ptr<helics::apps::App>
anon_unknown.dwarf_ef4e5::buildApp(string_view type,string_view appName,FederateInfo *fedInfo)

{
  bool bVar1;
  char *pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  char *pcVar4;
  element_type *peVar5;
  shared_ptr<helics::apps::App> sVar6;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  string_view appName_local;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  
  pcVar4 = type._M_str;
  peVar5 = (element_type *)type._M_len;
  appName_local._M_len = (size_t)appName._M_str;
  pcVar2 = (char *)appName._M_len;
  __y._M_str = "player";
  __y._M_len = 6;
  __x._M_str = pcVar2;
  __x._M_len = (size_t)pcVar4;
  appName_local._M_str = (char *)fedInfo;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    std::
    make_shared<helics::apps::Player,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
              (&local_48,(FederateInfo *)&appName_local);
  }
  else {
    __y_00._M_str = "recorder";
    __y_00._M_len = 8;
    __x_00._M_str = pcVar2;
    __x_00._M_len = (size_t)pcVar4;
    bVar1 = std::operator==(__x_00,__y_00);
    if (bVar1) {
      std::
      make_shared<helics::apps::Recorder,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                (&local_48,(FederateInfo *)&appName_local);
    }
    else {
      __y_01._M_str = "connector";
      __y_01._M_len = 9;
      __x_01._M_str = pcVar2;
      __x_01._M_len = (size_t)pcVar4;
      bVar1 = std::operator==(__x_01,__y_01);
      if (bVar1) {
        std::
        make_shared<helics::apps::Connector,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                  (&local_48,(FederateInfo *)&appName_local);
      }
      else {
        __y_02._M_str = "echo";
        __y_02._M_len = 4;
        __x_02._M_str = pcVar2;
        __x_02._M_len = (size_t)pcVar4;
        bVar1 = std::operator==(__x_02,__y_02);
        if (bVar1) {
          std::
          make_shared<helics::apps::Echo,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                    (&local_48,(FederateInfo *)&appName_local);
        }
        else {
          __y_03._M_str = "clone";
          __y_03._M_len = 5;
          __x_03._M_str = pcVar2;
          __x_03._M_len = (size_t)pcVar4;
          bVar1 = std::operator==(__x_03,__y_03);
          if (bVar1) {
            std::
            make_shared<helics::apps::Clone,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                      (&local_48,(FederateInfo *)&appName_local);
          }
          else {
            __y_04._M_str = "probe";
            __y_04._M_len = 5;
            __x_04._M_str = pcVar2;
            __x_04._M_len = (size_t)pcVar4;
            bVar1 = std::operator==(__x_04,__y_04);
            if (bVar1) {
              std::
              make_shared<helics::apps::Probe,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                        (&local_48,(FederateInfo *)&appName_local);
            }
            else {
              __y_05._M_str = "tracer";
              __y_05._M_len = 6;
              __x_05._M_str = pcVar2;
              __x_05._M_len = (size_t)pcVar4;
              bVar1 = std::operator==(__x_05,__y_05);
              if (bVar1) {
                std::
                make_shared<helics::apps::Tracer,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                          (&local_48,(FederateInfo *)&appName_local);
              }
              else {
                __y_06._M_str = "source";
                __y_06._M_len = 6;
                __x_06._M_str = pcVar2;
                __x_06._M_len = (size_t)pcVar4;
                bVar1 = std::operator==(__x_06,__y_06);
                if (!bVar1) {
                  peVar5->_vptr_App = (_func_int **)0x0;
                  (peVar5->fed).
                  super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       = (element_type *)0x0;
                  _Var3._M_pi = extraout_RDX;
                  goto LAB_0018f4b3;
                }
                std::
                make_shared<helics::apps::Source,std::basic_string_view<char,std::char_traits<char>>&,helics::FederateInfo&>
                          (&local_48,(FederateInfo *)&appName_local);
              }
            }
          }
        }
      }
    }
  }
  pcVar2 = local_48._M_str;
  local_48._M_str = (char *)0x0;
  peVar5->_vptr_App = (_func_int **)local_48._M_len;
  (peVar5->fed).super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pcVar2;
  local_48._M_len = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_str);
  _Var3._M_pi = extraout_RDX_00;
LAB_0018f4b3:
  sVar6.super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar6.super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  return (shared_ptr<helics::apps::App>)
         sVar6.super___shared_ptr<helics::apps::App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helics::apps::App> buildApp(std::string_view type, std::string_view appName, helics::FederateInfo& fedInfo)
{
    if (type == "player") {
        return std::make_shared<helics::apps::Player>(appName, fedInfo);
    }
    if (type == "recorder") {
        return std::make_shared<helics::apps::Recorder>(appName, fedInfo);
    }
    if (type == "connector") {
        return std::make_shared<helics::apps::Connector>(appName, fedInfo);
    }
    if (type == "echo") {
        return std::make_shared<helics::apps::Echo>(appName, fedInfo);
    }
    if (type == "clone") {
        return std::make_shared<helics::apps::Clone>(appName, fedInfo);
    }
    if (type == "probe") {
        return std::make_shared<helics::apps::Probe>(appName, fedInfo);
    }
    if (type == "tracer") {
        return std::make_shared<helics::apps::Tracer>(appName, fedInfo);
    }
    if (type == "source") {
        return std::make_shared<helics::apps::Source>(appName, fedInfo);
    }
    return nullptr;
}